

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join_dependent_filter.cpp
# Opt level: O3

void duckdb::ExtractConjunctedExpressions
               (Expression *expression,
               unordered_map<unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
               *expressions)

{
  pointer puVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var3;
  int iVar4;
  BoundConjunctionExpression *pBVar5;
  type expression_00;
  mapped_type *pmVar6;
  _Head_base<0UL,_duckdb::Expression_*,_false> this;
  pointer *__ptr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  pointer this_00;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  table_idxs;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_88;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_80;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  __buckets_ptr local_50;
  size_type local_48;
  __node_base local_40;
  size_type sStack_38;
  undefined4 local_30;
  undefined8 local_28;
  optional_idx oStack_20;
  
  if ((expression->super_BaseExpression).type == CONJUNCTION_AND) {
    pBVar5 = BaseExpression::Cast<duckdb::BoundConjunctionExpression>
                       (&expression->super_BaseExpression);
    puVar1 = (pBVar5->children).
             super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (pBVar5->children).
                   super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar1;
        this_00 = this_00 + 1) {
      expression_00 =
           unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (this_00);
      ExtractConjunctedExpressions(expression_00,expressions);
    }
  }
  else {
    iVar4 = (*(expression->super_BaseExpression)._vptr_BaseExpression[0xc])(expression);
    if ((char)iVar4 == '\0') {
      local_50 = (__buckets_ptr)&stack0xffffffffffffffe0;
      local_48 = 1;
      local_40._M_nxt = (_Hash_node_base *)0x0;
      sStack_38 = 0;
      local_30 = 0x3f800000;
      local_28 = 0;
      oStack_20.index = 0;
      local_70._8_8_ = 0;
      local_70._M_unused._M_object = &stack0xffffffffffffffb0;
      local_58 = ::std::
                 _Function_handler<void_(const_duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/rule/join_dependent_filter.cpp:20:52)>
                 ::_M_invoke;
      local_60 = ::std::
                 _Function_handler<void_(const_duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/rule/join_dependent_filter.cpp:20:52)>
                 ::_M_manager;
      ExpressionIterator::EnumerateChildren
                (expression,(function<void_(const_duckdb::Expression_&)> *)&local_70);
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,__destroy_functor);
      }
      if (sStack_38 == 1) {
        pmVar6 = ::std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)expressions,(key_type *)(local_40._M_nxt + 1));
        _Var2._M_head_impl =
             (pmVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        if (_Var2._M_head_impl == (Expression *)0x0) {
          (*(expression->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_80,expression);
          this._M_head_impl = local_80._M_head_impl;
        }
        else {
          (*(expression->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_88,expression);
          this._M_head_impl = (Expression *)operator_new(0x70);
          local_70._M_unused._M_object =
               (pmVar6->
               super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
               super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          (pmVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
          _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
          super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
          local_78._M_head_impl = local_88._M_head_impl;
          local_88._M_head_impl = (Expression *)0x0;
          BoundConjunctionExpression::BoundConjunctionExpression
                    ((BoundConjunctionExpression *)this._M_head_impl,CONJUNCTION_AND,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_70,
                     (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      *)&local_78);
          if (local_78._M_head_impl != (Expression *)0x0) {
            (*((local_78._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
          local_78._M_head_impl = (Expression *)0x0;
          if ((Expression *)local_70._M_unused._0_8_ != (Expression *)0x0) {
            (**(code **)(*local_70._M_unused._M_object + 8))();
          }
        }
        local_80._M_head_impl = (Expression *)0x0;
        _Var3._M_head_impl =
             (pmVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
             )._M_t.
             super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
             _M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        (pmVar6->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
        _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
        _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = this._M_head_impl;
        if (_Var3._M_head_impl != (Expression *)0x0) {
          (**(code **)(*(long *)&(_Var3._M_head_impl)->super_BaseExpression + 8))();
          if (local_80._M_head_impl != (Expression *)0x0) {
            (*((local_80._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
          }
        }
        local_80._M_head_impl = (Expression *)0x0;
        if ((_Var2._M_head_impl != (Expression *)0x0) &&
           (local_88._M_head_impl != (Expression *)0x0)) {
          (*((local_88._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
      }
      ::std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&stack0xffffffffffffffb0);
    }
  }
  return;
}

Assistant:

static inline void ExtractConjunctedExpressions(Expression &expression,
                                                unordered_map<idx_t, unique_ptr<Expression>> &expressions) {
	if (expression.GetExpressionType() == ExpressionType::CONJUNCTION_AND) {
		auto &conjunction = expression.Cast<BoundConjunctionExpression>();
		for (auto &child : conjunction.children) {
			ExtractConjunctedExpressions(*child, expressions);
		}
	} else if (!expression.IsVolatile()) {
		unordered_set<idx_t> table_idxs;
		GetTableIndices(expression, table_idxs);
		if (table_idxs.size() != 1) {
			return; // Needs to reference exactly one table
		}

		// If there was already an expression, AND it together
		auto &table_expressions = expressions[*table_idxs.begin()];
		table_expressions = table_expressions
		                        ? make_uniq<BoundConjunctionExpression>(ExpressionType::CONJUNCTION_AND,
		                                                                std::move(table_expressions), expression.Copy())
		                        : expression.Copy();
	}
}